

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean_test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_9eb85::CleanDeadTestCleanDeadPreservesInputs::
~CleanDeadTestCleanDeadPreservesInputs(CleanDeadTestCleanDeadPreservesInputs *this)

{
  CleanTest::~CleanTest((CleanTest *)this);
  operator_delete(this,0x218);
  return;
}

Assistant:

TEST_F(CleanDeadTest, CleanDeadPreservesInputs) {
  State state;
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state,
"rule cat\n"
"  command = cat $in > $out\n"
"build out1: cat in\n"
"build out2: cat in\n"
));
  // This manifest does not build out1 anymore, but makes
  // it an implicit input. CleanDead should detect this
  // and preserve it.
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
"build out2: cat in | out1\n"
));
  fs_.Create("in", "");
  fs_.Create("out1", "");
  fs_.Create("out2", "");

  BuildLog log1;
  string err;
  EXPECT_TRUE(log1.OpenForWrite(kTestFilename, *this, &err));
  ASSERT_EQ("", err);
  log1.RecordCommand(state.edges_[0], 15, 18);
  log1.RecordCommand(state.edges_[1], 20, 25);
  log1.Close();

  BuildLog log2;
  EXPECT_TRUE(log2.Load(kTestFilename, &err));
  ASSERT_EQ("", err);
  ASSERT_EQ(2u, log2.entries().size());
  ASSERT_TRUE(log2.LookupByOutput("out1"));
  ASSERT_TRUE(log2.LookupByOutput("out2"));

  // First use the manifest that describe how to build out1.
  Cleaner cleaner1(&state, config_, &fs_);
  EXPECT_EQ(0, cleaner1.CleanDead(log2.entries()));
  EXPECT_EQ(0, cleaner1.cleaned_files_count());
  EXPECT_EQ(0u, fs_.files_removed_.size());
  EXPECT_NE(0, fs_.Stat("in", &err));
  EXPECT_NE(0, fs_.Stat("out1", &err));
  EXPECT_NE(0, fs_.Stat("out2", &err));

  // Then use the manifest that does not build out1 anymore.
  Cleaner cleaner2(&state_, config_, &fs_);
  EXPECT_EQ(0, cleaner2.CleanDead(log2.entries()));
  EXPECT_EQ(0, cleaner2.cleaned_files_count());
  EXPECT_EQ(0u, fs_.files_removed_.size());
  EXPECT_NE(0, fs_.Stat("in", &err));
  EXPECT_NE(0, fs_.Stat("out1", &err));
  EXPECT_NE(0, fs_.Stat("out2", &err));

  // Nothing to do now.
  EXPECT_EQ(0, cleaner2.CleanDead(log2.entries()));
  EXPECT_EQ(0, cleaner2.cleaned_files_count());
  EXPECT_EQ(0u, fs_.files_removed_.size());
  EXPECT_NE(0, fs_.Stat("in", &err));
  EXPECT_NE(0, fs_.Stat("out1", &err));
  EXPECT_NE(0, fs_.Stat("out2", &err));
  log2.Close();
}